

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O2

void __thiscall Centaurus::ATNNode<unsigned_char>::~ATNNode(ATNNode<unsigned_char> *this)

{
  ~ATNNode(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~ATNNode()
    {
    }